

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsFile.cpp
# Opt level: O2

int AdsFile::Find(AdsDevice *route,string *basePath,size_t maxdepth,ostream *os)

{
  _List_node_base *p_Var1;
  bool bVar2;
  pointer p_Var3;
  ostream *poVar4;
  _List_node_base *p_Var5;
  int iVar6;
  long lVar7;
  list<Path,_std::allocator<Path>_> pendingDirs;
  undefined1 local_200 [8];
  undefined1 local_1f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  ostream *local_1d8;
  _List_node_base *local_1d0;
  __allocated_ptr<std::allocator<std::_List_node<Path>_>_> local_1c8;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  TcFileFindData parent;
  
  parent.hFile = 0;
  parent.dwFileAttributes = 0;
  local_1d8 = os;
  local_1d0 = (_List_node_base *)maxdepth;
  std::__cxx11::string::string((string *)parent.nReserved1,(string *)basePath);
  pendingDirs.super__List_base<Path,_std::allocator<Path>_>._M_impl._M_node._M_size = 0;
  pendingDirs.super__List_base<Path,_std::allocator<Path>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)&pendingDirs;
  pendingDirs.super__List_base<Path,_std::allocator<Path>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)&pendingDirs;
  for (lVar7 = 0; lVar7 != 0x28; lVar7 = lVar7 + 0x28) {
    p_Var3 = (pointer)operator_new(0x38);
    *(undefined8 *)(p_Var3->_M_storage)._M_storage =
         *(undefined8 *)((long)parent.nReserved1 + lVar7 + -8);
    local_200 = (undefined1  [8])&pendingDirs;
    local_1f8._0_8_ = p_Var3;
    std::__cxx11::string::string
              ((string *)((p_Var3->_M_storage)._M_storage + 8),
               (string *)((long)parent.nReserved1 + lVar7));
    local_1f8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    std::__allocated_ptr<std::allocator<std::_List_node<Path>_>_>::~__allocated_ptr
              ((__allocated_ptr<std::allocator<std::_List_node<Path>_>_> *)local_200);
    std::__detail::_List_node_base::_M_hook((_List_node_base *)p_Var3);
    pendingDirs.super__List_base<Path,_std::allocator<Path>_>._M_impl._M_node._M_size =
         pendingDirs.super__List_base<Path,_std::allocator<Path>_>._M_impl._M_node._M_size + 1;
  }
  std::__cxx11::string::~string((string *)parent.nReserved1);
  do {
    if (pendingDirs.super__List_base<Path,_std::allocator<Path>_>._M_impl._M_node.
        super__List_node_base._M_next == (_List_node_base *)&pendingDirs) {
      iVar6 = 0;
LAB_001238e1:
      std::__cxx11::_List_base<Path,_std::allocator<Path>_>::~_List_base
                (&pendingDirs.super__List_base<Path,_std::allocator<Path>_>);
      return iVar6;
    }
    std::__cxx11::string::string
              ((string *)&path,
               (string *)
               &pendingDirs.super__List_base<Path,_std::allocator<Path>_>._M_impl._M_node.
                super__List_node_base._M_next[1]._M_prev);
    p_Var5 = pendingDirs.super__List_base<Path,_std::allocator<Path>_>._M_impl._M_node.
             super__List_node_base._M_next;
    p_Var1 = pendingDirs.super__List_base<Path,_std::allocator<Path>_>._M_impl._M_node.
             super__List_node_base._M_next[1]._M_next;
    pendingDirs.super__List_base<Path,_std::allocator<Path>_>._M_impl._M_node._M_size =
         pendingDirs.super__List_base<Path,_std::allocator<Path>_>._M_impl._M_node._M_size - 1;
    std::__detail::_List_node_base::_M_unhook();
    std::__cxx11::string::~string((string *)&p_Var5[1]._M_prev);
    operator_delete(p_Var5);
    bVar2 = FindFirst(route,&parent,&path);
    if (bVar2) {
      std::__cxx11::string::~string((string *)&path);
      iVar6 = 0x70c;
      goto LAB_001238e1;
    }
    poVar4 = std::operator<<(local_1d8,(string *)&path);
    std::operator<<(poVar4,'\n');
    if ((p_Var1 < local_1d0 & (byte)parent.dwFileAttributes >> 4) == 1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
                     &path,"/*");
      bVar2 = FindFirst(route,&parent,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_200);
      std::__cxx11::string::~string((string *)local_200);
      while (bVar2 == false) {
        if ((parent._0_8_ & 0x1000000000) == 0) {
          poVar4 = std::operator<<(local_1d8,(string *)&path);
          poVar4 = std::operator<<(poVar4,'/');
          poVar4 = std::operator<<(poVar4,parent.cFileName);
          std::operator<<(poVar4,'\n');
        }
        else {
          local_200 = (undefined1  [8])((long)&p_Var1->_M_next + 1);
          std::operator+(&local_198,&path,'/');
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1f8,&local_198,parent.cFileName);
          p_Var5 = (_List_node_base *)operator_new(0x38);
          p_Var5[1]._M_next = (_List_node_base *)local_200;
          p_Var5[1]._M_prev = (_List_node_base *)&p_Var5[2]._M_prev;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._0_8_ == &local_1e8) {
            p_Var5[2]._M_prev =
                 (_List_node_base *)CONCAT71(local_1e8._1_7_,local_1e8._M_local_buf[0]);
            p_Var5[3]._M_next = (_List_node_base *)local_1e8._8_8_;
          }
          else {
            p_Var5[1]._M_prev = (_List_node_base *)local_1f8._0_8_;
            p_Var5[2]._M_prev =
                 (_List_node_base *)CONCAT71(local_1e8._1_7_,local_1e8._M_local_buf[0]);
          }
          p_Var5[2]._M_next = (_List_node_base *)local_1f8._8_8_;
          local_1f8._8_8_ = (_List_node_base *)0x0;
          local_1e8._M_local_buf[0] = '\0';
          local_1c8._M_ptr = (pointer)0x0;
          local_1f8._0_8_ = &local_1e8;
          local_1c8._M_alloc = (allocator<std::_List_node<Path>_> *)&pendingDirs;
          std::__allocated_ptr<std::allocator<std::_List_node<Path>_>_>::~__allocated_ptr
                    (&local_1c8);
          std::__detail::_List_node_base::_M_hook(p_Var5);
          pendingDirs.super__List_base<Path,_std::allocator<Path>_>._M_impl._M_node._M_size =
               pendingDirs.super__List_base<Path,_std::allocator<Path>_>._M_impl._M_node._M_size + 1
          ;
          std::__cxx11::string::~string((string *)local_1f8);
          std::__cxx11::string::~string((string *)&local_198);
        }
        bVar2 = FindNext(route,&parent,0,(char *)0x0);
      }
    }
    std::__cxx11::string::~string((string *)&path);
  } while( true );
}

Assistant:

int AdsFile::Find(const AdsDevice& route, const std::string& basePath, const size_t maxdepth, std::ostream& os)
{
    struct Path {
        size_t depth;
        std::string path;
    };
    std::list<struct Path> pendingDirs{{ 0, basePath} };
    while (!pendingDirs.empty()) {
        auto path = pendingDirs.front().path;
        auto depth = pendingDirs.front().depth;
        pendingDirs.pop_front();

        TcFileFindData parent;
        if (FindFirst(route, parent, path)) {
            return 1804;
        }

        // Path exists print it and prepare traversing
        os << path << '\n';

        if (parent.isDirectory() && (depth < maxdepth)) {
            // Finding files in a directory is a bit weird. We get only one entry per call and for
            // every call we pass the last found item to get the next. The first item is special.
            // To get the children of a directory we have to append '/*'to the path of the directory.
            for (auto last = FindFirst(route, parent, path + "/*"); !last; last = FindNext(route, parent)) {
                if (parent.isDirectory()) {
                    pendingDirs.push_back({depth + 1, path + '/' + parent.cFileName});
                } else {
                    os << path << '/' << parent.cFileName << '\n';
                }
            }
        }
    }
    return 0;
}